

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeChangeP4Full(Vdbe *p,Op *pOp,char *zP4,int n)

{
  CollSeq *pCVar1;
  int in_ECX;
  char *in_RDX;
  sqlite3 *in_RSI;
  undefined8 in_RDI;
  Vdbe *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*(char *)((long)&in_RSI->pVfs + 1) != '\0') {
    *(char *)((long)&in_RSI->pVfs + 1) = '\0';
    in_RSI->pDfltColl = (CollSeq *)0x0;
  }
  if (in_ECX < 0) {
    sqlite3VdbeChangeP4(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(char *)in_RSI,
                        (int)((ulong)in_RDX >> 0x20));
  }
  else {
    if (in_ECX == 0) {
      in_ECX = sqlite3Strlen30(in_stack_ffffffffffffffd8);
    }
    pCVar1 = (CollSeq *)sqlite3DbStrNDup(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    in_RSI->pDfltColl = pCVar1;
    *(undefined1 *)((long)&in_RSI->pVfs + 1) = 0xfa;
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE vdbeChangeP4Full(
  Vdbe *p,
  Op *pOp,
  const char *zP4,
  int n
){
  if( pOp->p4type ){
    assert( pOp->p4type > P4_FREE_IF_LE );
    pOp->p4type = 0;
    pOp->p4.p = 0;
  }
  if( n<0 ){
    sqlite3VdbeChangeP4(p, (int)(pOp - p->aOp), zP4, n);
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}